

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

bool __thiscall HEkkDual::dualInfoOk(HEkkDual *this,HighsLp *lp)

{
  HighsLp *pHVar1;
  HighsOptions *pHVar2;
  char *format;
  
  if (lp->num_row_ == this->solver_num_row && lp->num_col_ == this->solver_num_col) {
    pHVar1 = this->simplex_nla->lp_;
    if (lp->num_row_ == pHVar1->num_row_ && lp->num_col_ == pHVar1->num_col_) {
      return true;
    }
    pHVar2 = this->ekk_instance_->options_;
    format = "LP-Factor dimension incompatibility (%d, %d) != (%d, %d)\n";
  }
  else {
    pHVar2 = this->ekk_instance_->options_;
    format = "LP-Solver dimension incompatibility (%d, %d) != (%d, %d)\n";
  }
  highsLogDev(&(pHVar2->super_HighsOptionsStruct).log_options,kError,format);
  return false;
}

Assistant:

bool HEkkDual::dualInfoOk(const HighsLp& lp) {
  HighsInt lp_num_col = lp.num_col_;
  HighsInt lp_num_row = lp.num_row_;
  bool dimensions_ok;
  dimensions_ok = lp_num_col == solver_num_col && lp_num_row == solver_num_row;
  assert(dimensions_ok);
  if (!dimensions_ok) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                "LP-Solver dimension incompatibility (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ") != (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ")\n",
                lp_num_col, solver_num_col, lp_num_row, solver_num_row);
    return false;
  }
  dimensions_ok = lp_num_col == simplex_nla->lp_->num_col_ &&
                  lp_num_row == simplex_nla->lp_->num_row_;
  assert(dimensions_ok);
  if (!dimensions_ok) {
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                "LP-Factor dimension incompatibility (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ") != (%" HIGHSINT_FORMAT
                ", %" HIGHSINT_FORMAT ")\n",
                lp_num_col, simplex_nla->lp_->num_col_, lp_num_row,
                simplex_nla->lp_->num_row_);
    return false;
  }
  return true;
}